

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_charset_filter_module.c
# Opt level: O0

ngx_int_t ngx_http_charset_postconfiguration(ngx_conf_t *cf)

{
  long *plVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  ngx_http_output_header_filter_pt p_Var6;
  ngx_http_output_body_filter_pt p_Var7;
  ngx_http_charset_main_conf_t *mcf;
  ngx_http_charset_tables_t *tables;
  ngx_http_charset_recode_t *recode;
  ngx_http_charset_t *charset;
  ngx_uint_t t;
  ngx_uint_t i;
  ngx_int_t c;
  u_char **dst;
  u_char **src;
  ngx_conf_t *cf_local;
  
  plVar1 = *(long **)(*cf->ctx + ngx_http_charset_filter_module.ctx_index * 8);
  lVar2 = plVar1[10];
  lVar3 = plVar1[5];
  lVar4 = *plVar1;
  for (t = 0; t < (ulong)plVar1[0xb]; t = t + 1) {
    lVar5 = *(long *)(lVar2 + t * 0x10);
    charset = (ngx_http_charset_t *)0x0;
    while( true ) {
      if ((ngx_http_charset_t *)plVar1[6] <= charset) {
        if (cf->log->log_level != 0) {
          ngx_log_error_core(1,cf->log,0,"no \"charset_map\" between the charsets \"%V\" and \"%V\""
                             ,lVar4 + lVar5 * 0x20 + 8,
                             lVar4 + *(long *)(lVar2 + t * 0x10 + 8) * 0x20 + 8);
        }
        return -1;
      }
      if (((lVar5 == *(long *)(lVar3 + (long)charset * 0x20)) &&
          (*(long *)(lVar2 + t * 0x10 + 8) == *(long *)(lVar3 + (long)charset * 0x20 + 8))) ||
         ((lVar5 == *(long *)(lVar3 + (long)charset * 0x20 + 8) &&
          (*(long *)(lVar2 + t * 0x10 + 8) == *(long *)(lVar3 + (long)charset * 0x20))))) break;
      charset = (ngx_http_charset_t *)((long)&charset->tables + 1);
    }
  }
  charset = (ngx_http_charset_t *)0x0;
  do {
    p_Var7 = ngx_http_top_body_filter;
    p_Var6 = ngx_http_top_header_filter;
    if ((ngx_http_charset_t *)plVar1[6] <= charset) {
      ngx_http_top_header_filter = ngx_http_charset_header_filter;
      ngx_http_top_body_filter = ngx_http_charset_body_filter;
      ngx_http_next_body_filter = p_Var7;
      ngx_http_next_header_filter = p_Var6;
      return 0;
    }
    dst = *(u_char ***)(lVar4 + *(long *)(lVar3 + (long)charset * 0x20) * 0x20);
    if (dst == (u_char **)0x0) {
      dst = (u_char **)ngx_pcalloc(cf->pool,plVar1[1] << 3);
      if (dst == (u_char **)0x0) {
        return -1;
      }
      *(u_char ***)(lVar4 + *(long *)(lVar3 + (long)charset * 0x20) * 0x20) = dst;
    }
    c = *(long *)(lVar4 + *(long *)(lVar3 + (long)charset * 0x20 + 8) * 0x20);
    if (c == 0) {
      c = (ngx_int_t)ngx_pcalloc(cf->pool,plVar1[1] << 3);
      if ((void *)c == (void *)0x0) {
        return -1;
      }
      *(ngx_int_t *)(lVar4 + *(long *)(lVar3 + (long)charset * 0x20 + 8) * 0x20) = c;
    }
    dst[*(long *)(lVar3 + (long)charset * 0x20 + 8)] =
         *(u_char **)(lVar3 + (long)charset * 0x20 + 0x10);
    *(undefined8 *)(c + *(long *)(lVar3 + (long)charset * 0x20) * 8) =
         *(undefined8 *)(lVar3 + (long)charset * 0x20 + 0x18);
    charset = (ngx_http_charset_t *)((long)&charset->tables + 1);
  } while( true );
}

Assistant:

static ngx_int_t
ngx_http_charset_postconfiguration(ngx_conf_t *cf)
{
    u_char                       **src, **dst;
    ngx_int_t                      c;
    ngx_uint_t                     i, t;
    ngx_http_charset_t            *charset;
    ngx_http_charset_recode_t     *recode;
    ngx_http_charset_tables_t     *tables;
    ngx_http_charset_main_conf_t  *mcf;

    mcf = ngx_http_conf_get_module_main_conf(cf,
                                             ngx_http_charset_filter_module);

    recode = mcf->recodes.elts;
    tables = mcf->tables.elts;
    charset = mcf->charsets.elts;

    for (i = 0; i < mcf->recodes.nelts; i++) {

        c = recode[i].src;

        for (t = 0; t < mcf->tables.nelts; t++) {

            if (c == tables[t].src && recode[i].dst == tables[t].dst) {
                goto next;
            }

            if (c == tables[t].dst && recode[i].dst == tables[t].src) {
                goto next;
            }
        }

        ngx_log_error(NGX_LOG_EMERG, cf->log, 0,
                   "no \"charset_map\" between the charsets \"%V\" and \"%V\"",
                   &charset[c].name, &charset[recode[i].dst].name);
        return NGX_ERROR;

    next:
        continue;
    }


    for (t = 0; t < mcf->tables.nelts; t++) {

        src = charset[tables[t].src].tables;

        if (src == NULL) {
            src = ngx_pcalloc(cf->pool, sizeof(u_char *) * mcf->charsets.nelts);
            if (src == NULL) {
                return NGX_ERROR;
            }

            charset[tables[t].src].tables = src;
        }

        dst = charset[tables[t].dst].tables;

        if (dst == NULL) {
            dst = ngx_pcalloc(cf->pool, sizeof(u_char *) * mcf->charsets.nelts);
            if (dst == NULL) {
                return NGX_ERROR;
            }

            charset[tables[t].dst].tables = dst;
        }

        src[tables[t].dst] = tables[t].src2dst;
        dst[tables[t].src] = tables[t].dst2src;
    }

    ngx_http_next_header_filter = ngx_http_top_header_filter;
    ngx_http_top_header_filter = ngx_http_charset_header_filter;

    ngx_http_next_body_filter = ngx_http_top_body_filter;
    ngx_http_top_body_filter = ngx_http_charset_body_filter;

    return NGX_OK;
}